

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_ctrlpt.c
# Opt level: O2

int ScheduleGenaAutoRenew(int client_handle,int TimeOut,GenlibClientSubscription *sub)

{
  int iVar1;
  UpnpEventSubscribe *p;
  int *arg;
  UpnpString *pUVar2;
  int iVar3;
  ThreadPoolJob job;
  
  job.requestTime.tv_usec = 0;
  job.priority = LOW_PRIORITY;
  job.jobId = 0;
  job.free_func = (free_routine)0x0;
  job.requestTime.tv_sec = 0;
  job.func = (start_routine)0x0;
  job.arg = (void *)0x0;
  if (TimeOut == -1) {
    iVar3 = 0;
  }
  else {
    p = UpnpEventSubscribe_new();
    iVar3 = -0x68;
    if (p != (UpnpEventSubscribe *)0x0) {
      arg = (int *)calloc(1,0x10);
      if (arg == (int *)0x0) {
        free(p);
      }
      else {
        iVar3 = 0;
        UpnpEventSubscribe_set_ErrCode(p,0);
        UpnpEventSubscribe_set_TimeOut(p,TimeOut);
        pUVar2 = GenlibClientSubscription_get_SID(sub);
        UpnpEventSubscribe_set_SID(p,pUVar2);
        pUVar2 = GenlibClientSubscription_get_EventURL(sub);
        UpnpEventSubscribe_set_PublisherUrl(p,pUVar2);
        *arg = client_handle;
        *(UpnpEventSubscribe **)(arg + 2) = p;
        TPJobInit(&job,GenaAutoRenewSubscription,arg);
        TPJobSetFreeFunction(&job,free_subscribe_arg);
        TPJobSetPriority(&job,MED_PRIORITY);
        iVar1 = TimerThreadSchedule(&gTimerThread,(long)(TimeOut + -10),REL_SEC,&job,SHORT_TERM,
                                    arg + 1);
        if (iVar1 == 0) {
          GenlibClientSubscription_set_RenewEventId(sub,arg[1]);
        }
        else {
          free_subscribe_arg(arg);
          iVar3 = iVar1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int ScheduleGenaAutoRenew(
	/*! [in] Handle that also contains the subscription list. */
	int client_handle,
	/*! [in] The time out value of the subscription. */
	int TimeOut,
	/*! [in] Subscription being renewed. */
	GenlibClientSubscription *sub)
{
	UpnpEventSubscribe *RenewEvent = NULL;
	job_arg *arg = NULL;
	int return_code = GENA_SUCCESS;
	ThreadPoolJob job;

	memset(&job, 0, sizeof(job));

	if (TimeOut == UPNP_INFINITE) {
		return_code = GENA_SUCCESS;
		goto end_function;
	}

	RenewEvent = UpnpEventSubscribe_new();
	if (RenewEvent == NULL) {
		return_code = UPNP_E_OUTOF_MEMORY;
		goto end_function;
	}

	arg = (job_arg *)malloc(sizeof(job_arg));
	if (arg == NULL) {
		free(RenewEvent);
		return_code = UPNP_E_OUTOF_MEMORY;
		goto end_function;
	}
	memset(arg, 0, sizeof(job_arg));

	/* schedule expire event */
	UpnpEventSubscribe_set_ErrCode(RenewEvent, UPNP_E_SUCCESS);
	UpnpEventSubscribe_set_TimeOut(RenewEvent, TimeOut);
	UpnpEventSubscribe_set_SID(
		RenewEvent, GenlibClientSubscription_get_SID(sub));
	UpnpEventSubscribe_set_PublisherUrl(
		RenewEvent, GenlibClientSubscription_get_EventURL(sub));

	arg->handle = client_handle;
	arg->Event = RenewEvent;

	TPJobInit(&job, (start_routine)GenaAutoRenewSubscription, arg);
	TPJobSetFreeFunction(&job, (free_routine)free_subscribe_arg);
	TPJobSetPriority(&job, MED_PRIORITY);

	/* Schedule the job */
	return_code = TimerThreadSchedule(&gTimerThread,
		TimeOut - AUTO_RENEW_TIME,
		REL_SEC,
		&job,
		SHORT_TERM,
		&(arg->eventId));
	if (return_code != UPNP_E_SUCCESS) {
		free_subscribe_arg(arg);
		goto end_function;
	}

	GenlibClientSubscription_set_RenewEventId(sub, arg->eventId);

	return_code = GENA_SUCCESS;

end_function:

	return return_code;
}